

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Time.cpp
# Opt level: O2

uint32 Time::getTimeWithBase(uint32 base)

{
  long lVar1;
  undefined1 auVar2 [16];
  int iVar3;
  long lVar4;
  timespec local_30;
  TimeVal now;
  
  iVar3 = clock_gettime(1,&local_30);
  if (iVar3 == 0x16) {
    gettimeofday((timeval *)&now,(__timezone_ptr_t)0x0);
    local_30.tv_sec = now.tv_sec;
    local_30.tv_nsec = now.tv_usec * 1000;
  }
  getInitialTimespec();
  lVar1 = local_30.tv_nsec + getInitialTimespec::ts.tv_nsec;
  lVar4 = local_30.tv_nsec + -1000000000 + getInitialTimespec::ts.tv_nsec;
  if (lVar1 < 0x3b9aca01) {
    lVar4 = lVar1;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (ulong)base * lVar4;
  return SUB164(auVar2 / ZEXT816(1000000000),0) +
         ((uint)(1000000000 < lVar1) + (int)local_30.tv_sec + (int)getInitialTimespec::ts.tv_sec) *
         base;
}

Assistant:

uint32 getTimeWithBase(const uint32 base)
    {
#ifdef _WIN32
        return (uint32)getTimeWithBaseHiRes(base);
#elif defined(_LINUX)
        struct timespec ts;
        if (clock_gettime(CLOCK_MONOTONIC, &ts) == EINVAL)
        {
            TimeVal now;
            gettimeofday(&now, NULL);
            ts.tv_sec = now.tv_sec;
            ts.tv_nsec = now.tv_usec * 1000;
        }
        struct timespec init = getInitialTimespec();
        ts.tv_nsec += init.tv_nsec; ts.tv_sec += init.tv_sec;
        if (ts.tv_nsec > 1000000000) { ts.tv_sec ++; ts.tv_nsec -= 1000000000; }
        uint64 fracPart = (uint64)ts.tv_nsec * base;
        uint64 longTimeInBase = ((uint64)ts.tv_sec * base) + (uint64)(fracPart / 1000000000);
        return (uint32)longTimeInBase;
#else
        TimeVal now;
        gettimeofday(&now, NULL);

        uint64 fracPart = (uint64)now.tv_usec * base;
        uint64 longTimeInBase = ((uint64)now.tv_sec * base) + (uint64)(fracPart / 1000000); 
        return (uint32)longTimeInBase;
#endif
    }